

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O0

void __thiscall QTuioHandler::process2DCurSet(QTuioHandler *this,QOscMessage *message)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QDebug *o;
  const_reference pQVar4;
  QTuioCursor *this_00;
  QTuioCursor *in_RDI;
  long in_FS_OFFSET;
  undefined4 uVar5;
  float vx_00;
  float vy_00;
  float acceleration_00;
  QTuioCursor *cur;
  float acceleration;
  float vy;
  float vx;
  float y;
  float x;
  Iterator it;
  int cursorId;
  QList<QVariant> arguments;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QOscMessage *in_stack_fffffffffffffe98;
  float x_00;
  char *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffee8;
  QDebug local_108 [5];
  QDebug local_e0;
  iterator local_d8;
  iterator local_d0;
  undefined4 local_c4;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90 [5];
  QDebug local_68;
  QList<QVariant> local_60;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_60.d.ptr = (QVariant *)0xaaaaaaaaaaaaaaaa;
  local_60.d.size = -0x5555555555555556;
  QOscMessage::arguments(in_stack_fffffffffffffe98);
  qVar3 = QList<QVariant>::size(&local_60);
  if (qVar3 < 7) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcTuioSet();
    anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,
               (QLoggingCategory *)in_stack_fffffffffffffe98);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x110e0c);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8,(int)((ulong)in_RDI >> 0x20),
                 &in_stack_fffffffffffffe98->m_isValid,(char *)0x110e25);
      QMessageLogger::warning();
      in_stack_fffffffffffffe98 =
           (QOscMessage *)
           QDebug::operator<<((QDebug *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                              in_stack_fffffffffffffee8);
      QList<QVariant>::size(&local_60);
      QDebug::operator<<((QDebug *)in_RDI,(qint64)in_stack_fffffffffffffe98);
      QDebug::~QDebug(&local_68);
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe98);
    iVar2 = QVariant::userType((QVariant *)0x110eac);
    if (iVar2 == 2) {
      QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe98);
      iVar2 = QVariant::userType((QVariant *)0x110ecf);
      if (iVar2 == 0x26) {
        QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe98);
        iVar2 = QVariant::userType((QVariant *)0x110ef2);
        if (iVar2 == 0x26) {
          QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe98);
          iVar2 = QVariant::userType((QVariant *)0x110f11);
          if (iVar2 == 0x26) {
            QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe98);
            iVar2 = QVariant::userType((QVariant *)0x110f30);
            if (iVar2 == 0x26) {
              QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe98);
              iVar2 = QVariant::userType((QVariant *)0x110f4f);
              if (iVar2 == 0x26) {
                pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                             (qsizetype)in_stack_fffffffffffffe98);
                local_c4 = QVariant::toInt((bool *)pQVar4);
                pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                             (qsizetype)in_stack_fffffffffffffe98);
                QVariant::toFloat((bool *)pQVar4);
                pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                             (qsizetype)in_stack_fffffffffffffe98);
                uVar5 = QVariant::toFloat((bool *)pQVar4);
                pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                             (qsizetype)in_stack_fffffffffffffe98);
                vx_00 = (float)QVariant::toFloat((bool *)pQVar4);
                pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                             (qsizetype)in_stack_fffffffffffffe98);
                vy_00 = (float)QVariant::toFloat((bool *)pQVar4);
                pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                             (qsizetype)in_stack_fffffffffffffe98);
                acceleration_00 = (float)QVariant::toFloat((bool *)pQVar4);
                local_d0._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
                local_d0._M_node =
                     (_Base_ptr)
                     QMap<int,_QTuioCursor>::find
                               ((QMap<int,_QTuioCursor> *)CONCAT44(uVar5,vx_00),
                                (int *)CONCAT44(vy_00,acceleration_00));
                local_d8._M_node =
                     (_Base_ptr)
                     QMap<int,_QTuioCursor>::end
                               ((QMap<int,_QTuioCursor> *)CONCAT44(vy_00,acceleration_00));
                bVar1 = operator==((iterator *)in_RDI,(iterator *)in_stack_fffffffffffffe98);
                if (bVar1) {
                  local_38 = 0xaaaaaaaaaaaaaaaa;
                  local_30 = 0xaaaaaaaaaaaaaaaa;
                  lcTuioSet();
                  anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                  QLoggingCategoryMacroHolder
                            ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,
                             (QLoggingCategory *)in_stack_fffffffffffffe98);
                  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                 operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_38),
                        bVar1) {
                    anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1111eb);
                    QMessageLogger::QMessageLogger
                              ((QMessageLogger *)CONCAT44(vy_00,acceleration_00),
                               in_stack_fffffffffffffea8,(int)((ulong)in_RDI >> 0x20),
                               &in_stack_fffffffffffffe98->m_isValid,(char *)0x111201);
                    QMessageLogger::warning();
                    QDebug::operator<<((QDebug *)CONCAT44(uVar5,vx_00),in_stack_fffffffffffffee8);
                    QDebug::operator<<((QDebug *)in_RDI,
                                       (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
                    QDebug::~QDebug(&local_e0);
                    local_30 = local_30 & 0xffffffffffffff00;
                  }
                }
                else {
                  local_48 = 0xaaaaaaaaaaaaaaaa;
                  local_40 = 0xaaaaaaaaaaaaaaaa;
                  lcTuioSet();
                  anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                  QLoggingCategoryMacroHolder
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
                             (QLoggingCategory *)in_stack_fffffffffffffe98);
                  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                 operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_48),
                        bVar1) {
                    anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1112b3);
                    QMessageLogger::QMessageLogger
                              ((QMessageLogger *)CONCAT44(vy_00,acceleration_00),
                               in_stack_fffffffffffffea8,(int)((ulong)in_RDI >> 0x20),
                               &in_stack_fffffffffffffe98->m_isValid,(char *)0x1112c9);
                    QMessageLogger::debug();
                    QDebug::operator<<((QDebug *)CONCAT44(uVar5,vx_00),in_stack_fffffffffffffee8);
                    QDebug::operator<<((QDebug *)in_RDI,
                                       (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
                    QDebug::operator<<((QDebug *)CONCAT44(uVar5,vx_00),in_stack_fffffffffffffee8);
                    QDebug::operator<<((QDebug *)in_RDI,
                                       (float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
                    QDebug::operator<<((QDebug *)in_RDI,
                                       (float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
                    QDebug::operator<<((QDebug *)in_RDI,
                                       (float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
                    QDebug::operator<<((QDebug *)in_RDI,
                                       (float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
                    QDebug::operator<<((QDebug *)in_RDI,
                                       (float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
                    QDebug::~QDebug(local_108);
                    local_40 = local_40 & 0xffffffffffffff00;
                  }
                  this_00 = QMap<int,_QTuioCursor>::iterator::operator*((iterator *)0x111380);
                  x_00 = (float)((ulong)in_stack_fffffffffffffe98 >> 0x20);
                  QTuioCursor::setX(in_RDI,x_00);
                  QTuioCursor::setY(in_RDI,x_00);
                  QTuioCursor::setVX(this_00,vx_00);
                  QTuioCursor::setVY(this_00,vy_00);
                  QTuioCursor::setAcceleration(this_00,acceleration_00);
                }
                goto LAB_001113dd;
              }
            }
          }
        }
      }
    }
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    lcTuioSet();
    anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,
               (QLoggingCategory *)in_stack_fffffffffffffe98);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x110fae);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8,(int)((ulong)in_RDI >> 0x20),
                 &in_stack_fffffffffffffe98->m_isValid,(char *)0x110fc7);
      QMessageLogger::warning();
      o = QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                             ,in_stack_fffffffffffffee8);
      QDebug::QDebug(&local_98,o);
      operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (QList<QVariant> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      QDebug::~QDebug(local_90);
      QDebug::~QDebug(&local_98);
      QDebug::~QDebug(&local_a0);
      local_20 = local_20 & 0xffffffffffffff00;
    }
  }
LAB_001113dd:
  QList<QVariant>::~QList((QList<QVariant> *)0x1113ea);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTuioHandler::process2DCurSet(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();
    if (arguments.size() < 7) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with too few arguments: " << arguments.size();
        return;
    }

    if (QMetaType::Type(arguments.at(1).userType()) != QMetaType::Int   ||
        QMetaType::Type(arguments.at(2).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(3).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(4).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(5).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(6).userType()) != QMetaType::Float
       ) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with bad types: " << arguments;
        return;
    }

    int cursorId = arguments.at(1).toInt();
    float x = arguments.at(2).toFloat();
    float y = arguments.at(3).toFloat();
    float vx = arguments.at(4).toFloat();
    float vy = arguments.at(5).toFloat();
    float acceleration = arguments.at(6).toFloat();

    QMap<int, QTuioCursor>::Iterator it = m_activeCursors.find(cursorId);
    if (it == m_activeCursors.end()) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set for nonexistent cursor " << cursorId;
        return;
    }

    qCDebug(lcTuioSet) << "Processing SET for " << cursorId << " x: " << x << y << vx << vy << acceleration;
    QTuioCursor &cur = *it;
    cur.setX(x);
    cur.setY(y);
    cur.setVX(vx);
    cur.setVY(vy);
    cur.setAcceleration(acceleration);
}